

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void pulse_prog_banshee(CHAR_DATA *mob)

{
  CHAR_DATA *ch;
  int iVar1;
  int iVar2;
  uint uVar3;
  char *name;
  
  ch = mob->fighting;
  if (ch != (CHAR_DATA *)0x0) {
    iVar1 = number_percent();
    if (iVar1 < 0x15) {
      iVar1 = number_percent();
      if (iVar1 < 0x47) {
        iVar2 = number_percent();
        if (iVar2 < 0x29) {
          act("$n begins to howl mournfully, the unnatural notes piercing your mind.",mob,
              (void *)0x0,ch,4);
          name = "deafen";
        }
        else {
          act("$n screeches gleefully, mimicking a laugh.",mob,(void *)0x0,ch,4);
          act("$n\'s face contorts in terror.",ch,(void *)0x0,mob,4);
          act("$N\'s wailing causes your muscles to contort wildly in pain!",mob,(void *)0x0,ch,3);
          name = "weaken";
        }
      }
      else {
        name = (char *)0x0;
        act("$n lets out a terrible wail that forces you to cover your ears in pain!",mob,
            (void *)0x0,ch,2);
        act("$n lets out a terrible wail as $e draws near to $N.",mob,(void *)0x0,ch,1);
        iVar2 = dice(0x14,7);
        damage_new(mob,ch,iVar2 + 0x14,-1,0x12,true,false,0,1,"piercing scream");
      }
      if (iVar1 < 0x47) {
        uVar3 = skill_lookup(name);
        if (-1 < (int)uVar3) {
          (*skill_table[uVar3].spell_fun)(uVar3,mob->level + 1,mob,ch,0);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_banshee(CHAR_DATA *mob)
{
	CHAR_DATA *victim = mob->fighting;
	int sn, dam;
	char *spell = nullptr;

	if (!victim || number_percent() > 20)
		return;

	if (number_percent() > 70)
	{
		act("$n lets out a terrible wail that forces you to cover your ears in pain!", mob, 0, victim, TO_VICT);
		act("$n lets out a terrible wail as $e draws near to $N.", mob, 0, victim, TO_NOTVICT);

		dam = dice(20, 7) + 20;

		damage_new(mob, victim, dam, TYPE_UNDEFINED, DAM_SOUND, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "piercing scream");
	}
	else if (number_percent() > 40)
	{
		act("$n screeches gleefully, mimicking a laugh.", mob, 0, victim, TO_ALL);
		act("$n's face contorts in terror.", victim, 0, mob, TO_ALL);
		act("$N's wailing causes your muscles to contort wildly in pain!", mob, 0, victim, TO_CHAR);

		spell = "weaken";
	}
	else
	{
		act("$n begins to howl mournfully, the unnatural notes piercing your mind.", mob, 0, victim, TO_ALL);
		spell = "deafen";
	}

	if (!spell || (sn = skill_lookup(spell)) < 0)
		return;

	(*skill_table[sn].spell_fun)(sn, mob->level + 1, mob, victim, TARGET_CHAR);
}